

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O3

real __thiscall
fasttext::ProductQuantizer::assign_centroid
          (ProductQuantizer *this,real *x,real *c0,uint8_t *code,int32_t d)

{
  float *pfVar1;
  float *pfVar2;
  real *c;
  real *prVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  real rVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  
  auVar8 = ZEXT1664(ZEXT816(0) << 0x40);
  if (0 < d) {
    uVar5 = 0;
    do {
      pfVar1 = x + uVar5;
      pfVar2 = c0 + uVar5;
      uVar5 = uVar5 + 1;
      auVar9 = vfmadd231ss_fma(auVar8._0_16_,ZEXT416((uint)(*pfVar1 - *pfVar2)),
                               ZEXT416((uint)(*pfVar1 - *pfVar2)));
      auVar8 = ZEXT1664(auVar9);
    } while ((uint)d != uVar5);
  }
  rVar7 = auVar8._0_4_;
  *code = '\0';
  iVar4 = this->ksub_;
  if (1 < iVar4) {
    iVar6 = 1;
    prVar3 = c0 + d;
    do {
      auVar9 = ZEXT816(0) << 0x40;
      if (0 < d) {
        uVar5 = 0;
        do {
          pfVar1 = x + uVar5;
          pfVar2 = prVar3 + uVar5;
          uVar5 = uVar5 + 1;
          auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)(*pfVar1 - *pfVar2)),
                                   ZEXT416((uint)(*pfVar1 - *pfVar2)));
        } while ((uint)d != uVar5);
      }
      if (auVar9._0_4_ < auVar8._0_4_) {
        *code = (uint8_t)iVar6;
        auVar8 = ZEXT1664(auVar9);
        iVar4 = this->ksub_;
      }
      rVar7 = auVar8._0_4_;
      iVar6 = iVar6 + 1;
      prVar3 = prVar3 + d;
    } while (iVar6 < iVar4);
  }
  return rVar7;
}

Assistant:

real ProductQuantizer::assign_centroid(
    const real* x,
    const real* c0,
    uint8_t* code,
    int32_t d) const {
  const real* c = c0;
  real dis = distL2(x, c, d);
  code[0] = 0;
  for (auto j = 1; j < ksub_; j++) {
    c += d;
    real disij = distL2(x, c, d);
    if (disij < dis) {
      code[0] = (uint8_t)j;
      dis = disij;
    }
  }
  return dis;
}